

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O0

bool __thiscall
SocketClient::writeTo(SocketClient *this,String *host,uint16_t port,uchar *f_data,uint size)

{
  bool bVar1;
  size_t sVar2;
  uchar *puVar3;
  ssize_t sVar4;
  int *piVar5;
  element_type *peVar6;
  uint uVar7;
  int iVar8;
  SocketClient *args;
  enable_shared_from_this<SocketClient> *args_00;
  shared_ptr<SocketClient> *args_01;
  Error local_1c4;
  uint rem_1;
  undefined1 local_1b0 [8];
  SharedPtr loop_3;
  undefined1 local_198 [4];
  uint rem;
  SharedPtr loop_2;
  Log local_178;
  Log local_168;
  Log local_158;
  Log local_148;
  Log local_138;
  Error local_124;
  enable_shared_from_this<SocketClient> local_120;
  undefined1 local_110 [8];
  SharedPtr loop_1;
  undefined1 local_f8 [8];
  SharedPtr loop;
  Log local_d8;
  Log local_c8;
  Log local_b8;
  Log local_a8;
  Log local_98;
  ulong local_88;
  size_t writeBufferSize;
  int sendFlags;
  uint total;
  int e;
  undefined1 local_68 [8];
  Resolver resolver;
  SharedPtr socketPtr;
  uchar *data;
  uint size_local;
  uchar *f_data_local;
  uint16_t port_local;
  String *host_local;
  SocketClient *this_local;
  
  if ((size == 0) != (f_data == (uchar *)0x0)) {
    __assert_fail("(!size) == (!data)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                  ,0x1b1,
                  "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                 );
  }
  args = this;
  std::enable_shared_from_this<SocketClient>::shared_from_this
            ((enable_shared_from_this<SocketClient> *)&resolver.size);
  Resolver::Resolver((Resolver *)local_68);
  if (port != 0) {
    Resolver::resolve((Resolver *)local_68,host,port,(SharedPtr *)&resolver.size);
    args = (SocketClient *)host;
  }
  iVar8 = (int)args;
  writeBufferSize._4_4_ = 0;
  writeBufferSize._0_4_ = 0x4000;
  if ((this->mWriteWait & 1U) == 0) {
    bVar1 = Buffer::isEmpty(&this->mWriteBuffer);
    iVar8 = (int)args;
    if (!bVar1) {
      sVar2 = Buffer::size(&this->mWriteBuffer);
      local_88 = sVar2 - this->mWriteOffset;
      for (; iVar8 = (int)args, writeBufferSize._4_4_ < local_88;
          writeBufferSize._4_4_ = sendFlags + writeBufferSize._4_4_) {
        sVar2 = Buffer::size(&this->mWriteBuffer);
        if (sVar2 <= writeBufferSize._4_4_) {
          __assert_fail("mWriteBuffer.size() > total",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                        ,0x1c6,
                        "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                       );
        }
        if (resolver.res == (addrinfo *)0x0) {
          do {
            iVar8 = this->mFd;
            puVar3 = Buffer::data(&this->mWriteBuffer);
            puVar3 = puVar3 + this->mWriteOffset + (ulong)writeBufferSize._4_4_;
            sVar4 = ::write(iVar8,puVar3,local_88 - writeBufferSize._4_4_);
            iVar8 = (int)puVar3;
            sendFlags = (int)sVar4;
            bVar1 = false;
            if (sendFlags == -1) {
              piVar5 = __errno_location();
              bVar1 = *piVar5 == 4;
            }
          } while (bVar1);
        }
        else {
          do {
            iVar8 = this->mFd;
            puVar3 = Buffer::data(&this->mWriteBuffer);
            puVar3 = puVar3 + this->mWriteOffset + (ulong)writeBufferSize._4_4_;
            sVar4 = sendto(iVar8,puVar3,local_88 - writeBufferSize._4_4_,0x4000,
                           (sockaddr *)resolver.res,(socklen_t)resolver.addr);
            iVar8 = (int)puVar3;
            sendFlags = (int)sVar4;
            bVar1 = false;
            if (sendFlags == -1) {
              piVar5 = __errno_location();
              bVar1 = *piVar5 == 4;
            }
          } while (bVar1);
        }
        if ((this->mLogsEnabled & 1U) != 0) {
          debug();
          Log::operator<<(&local_d8,
                          (char *)&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
          Log::operator<<(&local_c8,(uint64_t)&local_d8);
          Log::operator<<(&local_b8,(char *)&local_c8);
          Log::operator<<(&local_a8,(int32_t)&local_b8);
          __errno_location();
          iVar8 = (int)&local_a8;
          Log::operator<<(&local_98,iVar8);
          Log::~Log(&local_98);
          Log::~Log(&local_a8);
          Log::~Log(&local_b8);
          Log::~Log(&local_c8);
          Log::~Log(&local_d8);
          Log::~Log((Log *)&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        }
        if (sendFlags == -1) {
          piVar5 = __errno_location();
          if ((*piVar5 != 0xb) && (piVar5 = __errno_location(), *piVar5 != 0xb)) {
            std::enable_shared_from_this<SocketClient>::shared_from_this(&local_120);
            local_124 = WriteError;
            args_00 = &local_120;
            Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::
            operator()((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                        *)&this->mSignalError,(shared_ptr<SocketClient> *)args_00,&local_124);
            iVar8 = (int)args_00;
            std::shared_ptr<SocketClient>::~shared_ptr((shared_ptr<SocketClient> *)&local_120);
            close(this,iVar8);
            this_local._7_1_ = 0;
            loop_1.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
                 = 1;
            goto LAB_00286586;
          }
          if (this->mWMode == Synchronous) {
            EventLoop::eventLoop();
            bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_f8);
            if (bVar1) {
              if (writeBufferSize._4_4_ != 0) {
                if (writeBufferSize._4_4_ < local_88) {
                  this->mWriteOffset = (ulong)writeBufferSize._4_4_ + this->mWriteOffset;
                }
                else {
                  this->mWriteOffset = 0;
                  Buffer::clear(&this->mWriteBuffer);
                }
                writeBufferSize._4_4_ = 0;
              }
              peVar6 = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_f8);
              iVar8 = this->mFd;
              uVar7 = EventLoop::processSocket(peVar6,iVar8,-1);
              if ((uVar7 & 2) == 0) {
                if (this->mFd != -1) goto LAB_00285ad2;
                this_local._7_1_ = 0;
                loop_1.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _4_4_ = 1;
              }
              else {
                loop_1.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _4_4_ = 3;
              }
            }
            else {
LAB_00285ad2:
              loop_1.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
              _4_4_ = 0;
            }
            std::shared_ptr<EventLoop>::~shared_ptr((shared_ptr<EventLoop> *)local_f8);
            if (loop_1.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _4_4_ != 0) {
              if (loop_1.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  ._4_4_ != 3) goto LAB_00286586;
              break;
            }
          }
          if (((this->mWriteWait ^ 0xffU) & 1) == 0) {
            __assert_fail("!mWriteWait",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                          ,0x1e1,
                          "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                         );
          }
          EventLoop::eventLoop();
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_110);
          if (bVar1) {
            peVar6 = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_110);
            iVar8 = this->mFd;
            EventLoop::updateSocket(peVar6,iVar8,7);
            this->mWriteWait = true;
          }
          std::shared_ptr<EventLoop>::~shared_ptr((shared_ptr<EventLoop> *)local_110);
          break;
        }
        args = (SocketClient *)&resolver.size;
        Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>>::operator()
                  ((Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)
                   &this->mSignalBytesWritten,(shared_ptr<SocketClient> *)args,&sendFlags);
      }
      if (writeBufferSize._4_4_ != 0) {
        if (local_88 < writeBufferSize._4_4_) {
          __assert_fail("total <= writeBufferSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                        ,0x1f2,
                        "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                       );
        }
        if (writeBufferSize._4_4_ < local_88) {
          this->mWriteOffset = (ulong)writeBufferSize._4_4_ + this->mWriteOffset;
        }
        else {
          this->mWriteOffset = 0;
          Buffer::clear(&this->mWriteBuffer);
        }
      }
    }
    if ((this->mFd == -1) || (f_data == (uchar *)0x0)) {
      this_local._7_1_ = this->mFd != -1;
      loop_1.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
      goto LAB_00286586;
    }
    writeBufferSize._4_4_ = 0;
    if (f_data == (uchar *)0x0 || size == 0) {
      __assert_fail("data != 0 && size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                    ,0x201,
                    "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                   );
    }
    bVar1 = Buffer::isEmpty(&this->mWriteBuffer);
    if (bVar1) {
      do {
        if (size <= writeBufferSize._4_4_) {
          __assert_fail("size > total",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                        ,0x205,
                        "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                       );
        }
        if (resolver.res == (addrinfo *)0x0) {
          do {
            puVar3 = f_data + writeBufferSize._4_4_;
            sVar4 = ::write(this->mFd,puVar3,(ulong)(size - writeBufferSize._4_4_));
            iVar8 = (int)puVar3;
            sendFlags = (int)sVar4;
            bVar1 = false;
            if (sendFlags == -1) {
              piVar5 = __errno_location();
              bVar1 = *piVar5 == 4;
            }
          } while (bVar1);
        }
        else {
          do {
            puVar3 = f_data + writeBufferSize._4_4_;
            sVar4 = sendto(this->mFd,puVar3,(ulong)(size - writeBufferSize._4_4_),0x4000,
                           (sockaddr *)resolver.res,(socklen_t)resolver.addr);
            iVar8 = (int)puVar3;
            sendFlags = (int)sVar4;
            bVar1 = false;
            if (sendFlags == -1) {
              piVar5 = __errno_location();
              bVar1 = *piVar5 == 4;
            }
          } while (bVar1);
        }
        if ((this->mLogsEnabled & 1U) != 0) {
          debug();
          Log::operator<<(&local_178,
                          (char *)&loop_2.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
          Log::operator<<(&local_168,(uint32_t)&local_178);
          Log::operator<<(&local_158,(char *)&local_168);
          Log::operator<<(&local_148,(int32_t)&local_158);
          __errno_location();
          iVar8 = (int)&local_148;
          Log::operator<<(&local_138,iVar8);
          Log::~Log(&local_138);
          Log::~Log(&local_148);
          Log::~Log(&local_158);
          Log::~Log(&local_168);
          Log::~Log(&local_178);
          Log::~Log((Log *)&loop_2.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        }
        if (sendFlags == -1) {
          piVar5 = __errno_location();
          if ((*piVar5 != 0xb) && (piVar5 = __errno_location(), *piVar5 != 0xb)) {
            std::enable_shared_from_this<SocketClient>::shared_from_this
                      ((enable_shared_from_this<SocketClient> *)&rem_1);
            local_1c4 = WriteError;
            args_01 = (shared_ptr<SocketClient> *)&rem_1;
            Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::
            operator()((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                        *)&this->mSignalError,args_01,&local_1c4);
            iVar8 = (int)args_01;
            std::shared_ptr<SocketClient>::~shared_ptr((shared_ptr<SocketClient> *)&rem_1);
            close(this,iVar8);
            this_local._7_1_ = 0;
            loop_1.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
                 = 1;
            goto LAB_00286586;
          }
          if (this->mWMode == Synchronous) {
            EventLoop::eventLoop();
            bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_198);
            if (bVar1) {
              loop_3.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
              _4_4_ = size - writeBufferSize._4_4_;
              if ((this->mMaxWriteBufferSize == 0) ||
                 (sVar2 = Buffer::size(&this->mWriteBuffer),
                 sVar2 + loop_3.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._4_4_ <= this->mMaxWriteBufferSize)) {
                sVar2 = Buffer::size(&this->mWriteBuffer);
                Buffer::reserve(&this->mWriteBuffer,
                                sVar2 + loop_3.
                                        super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi._4_4_);
                puVar3 = Buffer::end(&this->mWriteBuffer);
                memcpy(puVar3,f_data + writeBufferSize._4_4_,
                       (ulong)loop_3.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi._4_4_);
                sVar2 = Buffer::size(&this->mWriteBuffer);
                Buffer::resize(&this->mWriteBuffer,
                               sVar2 + loop_3.
                                       super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi._4_4_);
                if (this->mWriteOffset != 0) {
                  __assert_fail("!mWriteOffset",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                                ,0x21e,
                                "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                               );
                }
                peVar6 = std::
                         __shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                         operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_198);
                iVar8 = this->mFd;
                EventLoop::processSocket(peVar6,iVar8,-1);
                this_local._7_1_ = isConnected(this);
                loop_1.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _4_4_ = 1;
              }
              else {
                close(this,iVar8);
                this_local._7_1_ = 0;
                loop_1.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _4_4_ = 1;
              }
            }
            else {
              loop_1.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
              _4_4_ = 0;
            }
            std::shared_ptr<EventLoop>::~shared_ptr((shared_ptr<EventLoop> *)local_198);
            if (loop_1.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _4_4_ != 0) goto LAB_00286586;
          }
          if (((this->mWriteWait ^ 0xffU) & 1) == 0) {
            __assert_fail("!mWriteWait",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                          ,0x224,
                          "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                         );
          }
          EventLoop::eventLoop();
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1b0);
          if (bVar1) {
            peVar6 = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_1b0);
            iVar8 = this->mFd;
            EventLoop::updateSocket(peVar6,iVar8,7);
            this->mWriteWait = true;
          }
          std::shared_ptr<EventLoop>::~shared_ptr((shared_ptr<EventLoop> *)local_1b0);
          goto LAB_0028643a;
        }
        Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>>::operator()
                  ((Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)
                   &this->mSignalBytesWritten,(shared_ptr<SocketClient> *)&resolver.size,&sendFlags)
        ;
        writeBufferSize._4_4_ = sendFlags + writeBufferSize._4_4_;
        if (size < writeBufferSize._4_4_) {
          __assert_fail("total <= size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                        ,0x233,
                        "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                       );
        }
      } while (writeBufferSize._4_4_ != size);
      this_local._7_1_ = 1;
      loop_1.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
      goto LAB_00286586;
    }
  }
LAB_0028643a:
  if (writeBufferSize._4_4_ < size) {
    uVar7 = size - writeBufferSize._4_4_;
    if ((this->mMaxWriteBufferSize != 0) &&
       (sVar2 = Buffer::size(&this->mWriteBuffer), this->mMaxWriteBufferSize < sVar2 + uVar7)) {
      close(this,iVar8);
      this_local._7_1_ = 0;
      loop_1.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
      goto LAB_00286586;
    }
    sVar2 = Buffer::size(&this->mWriteBuffer);
    Buffer::reserve(&this->mWriteBuffer,sVar2 + uVar7);
    puVar3 = Buffer::end(&this->mWriteBuffer);
    memcpy(puVar3,f_data + writeBufferSize._4_4_,(ulong)uVar7);
    sVar2 = Buffer::size(&this->mWriteBuffer);
    Buffer::resize(&this->mWriteBuffer,sVar2 + uVar7);
  }
  this_local._7_1_ = 1;
  loop_1.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
LAB_00286586:
  Resolver::~Resolver((Resolver *)local_68);
  std::shared_ptr<SocketClient>::~shared_ptr((shared_ptr<SocketClient> *)&resolver.size);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SocketClient::writeTo(const String& host, uint16_t port, const unsigned char* f_data, unsigned int size)
{
#ifdef _WIN32
    const char *data = reinterpret_cast<const char*>(f_data);
#else
    const unsigned char *data = f_data;
#endif

#ifdef RCT_SOCKETCLIENT_TIMING_ENABLED
    if (size) {
        mWrites.append(size);
    }
#endif

    assert((!size) == (!data));
    SocketClient::SharedPtr socketPtr = shared_from_this();

    Resolver resolver;
    if (port != 0)
        resolver.resolve(host, port, socketPtr);

    int e;
    unsigned int total = 0;

#ifdef HAVE_NOSIGNAL
    const int sendFlags = MSG_NOSIGNAL;
#else
    const int sendFlags = 0;
#endif

    if (!mWriteWait) {
        if (!mWriteBuffer.isEmpty()) {
            // assert(mWriteOffset < mWriteBuffer.size());
            const size_t writeBufferSize = mWriteBuffer.size() - mWriteOffset;
            while (total < writeBufferSize) {
                assert(mWriteBuffer.size() > total);
                if (resolver.addr) {
                    eintrwrap(e, ::sendto(mFd, reinterpret_cast<const char*>(mWriteBuffer.data()) + total + mWriteOffset, writeBufferSize - total,
                                          sendFlags, resolver.addr, resolver.size));
                } else {
                    eintrwrap(e, ::write(mFd, mWriteBuffer.data() + total + mWriteOffset, writeBufferSize - total));
                }
                DEBUG() << "SENT(1)" << (writeBufferSize - total) << "BYTES" << e << errno;
                if (e == -1) {
                    if (errno == EAGAIN || errno == EWOULDBLOCK) {
                        if (mWMode == Synchronous) {
                            if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                                if (total) {
                                    if (total < writeBufferSize) {
                                        mWriteOffset += total;
                                    } else {
                                        mWriteOffset = 0;
                                        mWriteBuffer.clear();
                                    }
                                    total = 0;
                                }
                                if (loop->processSocket(mFd) & EventLoop::SocketWrite)
                                    break;
                                if (mFd == -1)
                                    return false;
                            }
                        }
                        assert(!mWriteWait);
                        if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                            loop->updateSocket(mFd, EventLoop::SocketRead|EventLoop::SocketWrite|EventLoop::SocketOneShot);
                            mWriteWait = true;
                        }
                        break;
                    } else {
                        // bad
                        mSignalError(shared_from_this(), WriteError);
                        close();
                        return false;
                    }
                }
                mSignalBytesWritten(socketPtr, e);
                total += e;
            }
            if (total) {
                assert(total <= writeBufferSize);
                if (total < writeBufferSize) {
                    mWriteOffset += total;
                } else {
                    mWriteOffset = 0;
                    mWriteBuffer.clear();
                }
            }
        }

        if (mFd == -1 || !data) {
            return mFd != -1;
        }
        total = 0;

        assert(data != 0 && size > 0);

        if (mWriteBuffer.isEmpty()) {
            for (;;) {
                assert(size > total);
                if (resolver.addr) {
                    eintrwrap(e, ::sendto(mFd, data + total, size - total,
                                          sendFlags, resolver.addr, resolver.size));
                } else {
#ifdef _WIN32
                    eintrwrap(e, ::send(mFd, data + total, size - total, 0));
#else
                    eintrwrap(e, ::write(mFd, data + total, size - total));
#endif
                }
                DEBUG() << "SENT(2)" << (size - total) << "BYTES" << e << errno;
                if (e == -1) {
                    if (errno == EAGAIN || errno == EWOULDBLOCK) {
                        if (mWMode == Synchronous) {
                            if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                                // store the rest
                                const unsigned int rem = size - total;
                                if (mMaxWriteBufferSize && mWriteBuffer.size() + rem > mMaxWriteBufferSize) {
                                    close();
                                    return false;
                                }
                                mWriteBuffer.reserve(mWriteBuffer.size() + rem);
                                memcpy(mWriteBuffer.end(), data + total, rem);
                                mWriteBuffer.resize(mWriteBuffer.size() + rem);
                                assert(!mWriteOffset);

                                (void)loop->processSocket(mFd);
                                return isConnected();
                            }
                        }
                        assert(!mWriteWait);
                        if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                            loop->updateSocket(mFd, EventLoop::SocketRead|EventLoop::SocketWrite|EventLoop::SocketOneShot);
                            mWriteWait = true;
                        }
                        break;
                    } else {
                        // bad
                        mSignalError(shared_from_this(), WriteError);
                        close();
                        return false;
                    }
                }
                mSignalBytesWritten(socketPtr, e);
                total += e;
                assert(total <= size);
                if (total == size) {
                    // we're done
                    return true;
                }
            }
        }
    }

    if (total < size) {
        // store the rest
        const unsigned int rem = size - total;
        if (mMaxWriteBufferSize && mWriteBuffer.size() + rem > mMaxWriteBufferSize) {
            close();
            return false;
        }
        mWriteBuffer.reserve(mWriteBuffer.size() + rem);
        memcpy(mWriteBuffer.end(), data + total, rem);
        mWriteBuffer.resize(mWriteBuffer.size() + rem);
    }
    return true;
}